

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O0

void module_with_async_launch(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  anon_class_8_1_6ca262cf aVar2;
  double __x;
  ResultBuilder DOCTEST_RB;
  Task m1_1;
  Taskflow f1;
  Task E;
  Task D;
  Task C;
  Task B;
  Task A;
  int cnt;
  Taskflow f0;
  Executor executor;
  Task *in_stack_fffffffffffffb18;
  Taskflow *target;
  Result *res;
  Taskflow *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  future<void> *in_stack_fffffffffffffb30;
  Task *in_stack_fffffffffffffb38;
  Enum at;
  Taskflow *in_stack_fffffffffffffb40;
  ResultBuilder *this;
  Executor *this_00;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  Taskflow *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffffb70;
  FlowBuilder *in_stack_fffffffffffffb78;
  anon_class_8_1_ba1d3cc9 *in_stack_fffffffffffffb90;
  int *in_stack_fffffffffffffba0;
  TestCaseData *in_stack_fffffffffffffba8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  Executor *in_stack_fffffffffffffc18;
  undefined1 local_3c0 [40];
  undefined1 local_398 [280];
  __pthread_internal_list *local_280;
  __pthread_internal_list *local_270;
  __pthread_internal_list *local_260;
  __pthread_internal_list *local_250;
  __pthread_internal_list *local_240;
  __pthread_internal_list local_22c [13];
  Executor local_150;
  
  this_00 = &local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11b716);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb40);
  local_22c[0].__prev._0_4_ = 0;
  local_240 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:443:23),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60);
  local_250 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:444:23),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60);
  local_260 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:445:23),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60);
  local_270 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:446:23),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60);
  local_280 = local_22c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:447:23),_nullptr>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb40);
  local_398._0_8_ = local_22c;
  target = (Taskflow *)local_398;
  local_398._8_8_ = local_398._0_8_;
  local_398._16_8_ = local_398._0_8_;
  local_398._24_8_ = local_398._0_8_;
  local_398._32_8_ = local_398._0_8_;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:458:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:459:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:460:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:461:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:462:5),_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffffb60,
             (anon_class_8_1_ba1d3cc9 *)
             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_stack_fffffffffffffb90
            );
  this = (ResultBuilder *)local_3c0;
  std::tie<tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
            (in_stack_fffffffffffffb38,(Task *)in_stack_fffffffffffffb30,
             (Task *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             (Task *)in_stack_fffffffffffffb20,(Task *)target);
  std::tuple<tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::operator=
            ((tuple<tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> *)
             in_stack_fffffffffffffb20,
             (tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,(Task *)target);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,(Task *)target);
  tf::FlowBuilder::composed_of<tf::Taskflow>
            ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb20,(Task *)target);
  aVar2 = tf::make_module_task<tf::Taskflow&>(target);
  at = (Enum)((ulong)aVar2.target >> 0x20);
  tf::Executor::
  async<tf::Algorithm::make_module_task<tf::Taskflow&>(tf::Taskflow&)::_lambda(tf::Runtime&)_1_>
            ((Executor *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             (anon_class_8_1_6ca262cf *)in_stack_fffffffffffffb20);
  std::future<void>::get(in_stack_fffffffffffffb30);
  std::future<void>::~future((future<void> *)0x11ba37);
  res = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            (this,at,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
             (char *)in_stack_fffffffffffffb20,"",(char *)this_00);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffb74,DT_REQUIRE);
  doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
            ((ExpressionDecomposer *)in_stack_fffffffffffffb20,(int *)res);
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Expression_lhs<const_int_&> *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffb20,res);
  doctest::detail::Result::~Result((Result *)0x11baf9);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffba8,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffb20);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11bc5d);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffb20);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffb20);
    tf::Executor::~Executor(this_00);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void module_with_async_launch(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  executor.async(tf::make_module_task(f1)).get(); 

  REQUIRE(cnt == 10);
}